

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinParseYaml
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  code *pcVar1;
  Location loc_00;
  Interpreter IVar2;
  json_value jVar3;
  bool bVar4;
  error_flags eVar5;
  size_t sVar6;
  AST *pAVar7;
  long lVar8;
  Callbacks *cb;
  allocator_type *in_RCX;
  string *s;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *s_00;
  ulong uVar9;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  json j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  string value;
  bool filled;
  Tree doc;
  Tree tree;
  undefined1 local_578 [8];
  json_value local_570;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_568;
  long *local_548;
  long local_540;
  long local_538 [2];
  Interpreter *local_528;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_520;
  long *local_508 [2];
  long local_4f8 [2];
  undefined1 local_4e8 [8];
  json_value local_4e0;
  long *local_4d8 [2];
  long local_4c8 [2];
  undefined1 local_4b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8 [15];
  undefined1 local_3b8 [32];
  _Base_ptr local_398;
  ios_base local_338 [264];
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [15];
  Tree local_130;
  
  local_3b8._0_8_ = local_3b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"parseYaml","");
  local_130.m_buf._0_4_ = 0x13;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_130;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_520,__l,in_RCX);
  validateBuiltinArgs(this,loc,(string *)local_3b8,args,&local_520);
  if (local_520.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_520.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_520.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_520.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
    operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
  }
  encode_utf8((string *)local_4d8,
              (UString *)
              ((((args->
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                 )._M_impl.super__Vector_impl_data._M_start)->v).h + 1));
  treeFromString(&local_130,(Interpreter *)local_4d8,s);
  local_578[0] = (Interpreter)0x0;
  local_570.object = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_578);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_578);
  sVar6 = c4::yml::Tree::root_id(&local_130);
  if ((sVar6 == 0xffffffffffffffff) || (local_130.m_cap <= sVar6)) {
    eVar5 = c4::get_error_flags();
    if ((eVar5 & 1) != 0) {
      bVar4 = c4::is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        pAVar7 = (AST *)(*pcVar1)();
        return pAVar7;
      }
    }
    local_3b8._0_8_ = (pointer)0x0;
    local_3b8._8_8_ = 0x4b86;
    local_3b8._16_8_ = 0;
    local_3b8._24_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_398 = (_Base_ptr)0x65;
    loc_00.super_LineCol.col = 0;
    loc_00.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_00.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_00.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_00.name.len = 0x65;
    c4::yml::error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_00);
  }
  if ((~*(uint *)(CONCAT44(local_130.m_buf._4_4_,local_130.m_buf._0_4_) + sVar6 * 0x90) & 0x28) == 0
     ) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_3b8);
    local_230._8_8_ = 0;
    local_230._0_8_ = (stringstream *)local_3b8;
    c4::yml::
    Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emit_as((Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_230,EMIT_YAML,&local_130,true);
    std::__cxx11::stringbuf::str();
    local_548 = local_538;
    local_528 = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"---\n","");
    local_230._0_8_ = local_230 + 0x10;
    uVar9 = 0;
    local_230._8_8_ = 0;
    local_220[0]._M_local_buf[0] = '\0';
    local_568.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_568.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_568.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while( true ) {
      lVar8 = std::__cxx11::string::find((char *)local_508,(ulong)local_548,uVar9);
      if (lVar8 == -1) break;
      std::__cxx11::string::substr((ulong)local_4b8,(ulong)local_508);
      std::__cxx11::string::operator=((string *)local_230,(string *)local_4b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_4b8._1_7_,local_4b8[0]) != local_4a8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_4b8._1_7_,local_4b8[0]),
                        local_4a8[0]._M_allocated_capacity + 1);
      }
      uVar9 = lVar8 + local_540;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_568,(value_type *)local_230);
    }
    std::__cxx11::string::substr((ulong)local_4b8,(ulong)local_508);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_568,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_4b8._1_7_,local_4b8[0]) != local_4a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_4b8._1_7_,local_4b8[0]),
                      local_4a8[0]._M_allocated_capacity + 1);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_230 + 0x10)) {
      operator_delete((void *)local_230._0_8_,
                      CONCAT71(local_220[0]._M_allocated_capacity._1_7_,local_220[0]._M_local_buf[0]
                              ) + 1);
    }
    if (local_548 != local_538) {
      operator_delete(local_548,local_538[0] + 1);
    }
    if (local_508[0] != local_4f8) {
      operator_delete(local_508[0],local_4f8[0] + 1);
    }
    cb = c4::yml::get_callbacks();
    c4::yml::Tree::Tree((Tree *)local_230,cb);
    if (local_568.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_568.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar8 = 0;
      uVar9 = 0;
      s_00 = extraout_RDX;
      do {
        if (*(long *)((long)&(local_568.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar8)
            != 0) {
          treeFromString((Tree *)local_4b8,
                         (Interpreter *)
                         ((long)&((local_568.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar8),s_00);
          c4::yml::Tree::operator=((Tree *)local_230,(Tree *)local_4b8);
          c4::yml::Tree::~Tree((Tree *)local_4b8);
          (anonymous_namespace)::Interpreter::yamlTreeToJson_abi_cxx11_
                    ((Interpreter *)local_4b8,(Tree *)local_230);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_578,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_4b8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_4b8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)(local_4b8 + 8),(value_t)local_4b8[0]);
          s_00 = extraout_RDX_00;
        }
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x20;
      } while (uVar9 < (ulong)((long)local_568.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_568.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    c4::yml::Tree::~Tree((Tree *)local_230);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_568);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_3b8);
    std::ios_base::~ios_base(local_338);
    this = local_528;
  }
  else {
    (anonymous_namespace)::Interpreter::yamlTreeToJson_abi_cxx11_
              ((Interpreter *)local_4e8,&local_130);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_4e8);
    jVar3 = local_570;
    IVar2 = local_578[0];
    local_578[0] = local_4e8[0];
    local_4e8[0] = IVar2;
    local_570 = local_4e0;
    local_4e0 = jVar3;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_578);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_4e8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_4e8 + 8),(value_t)local_4e8[0]);
  }
  otherJsonToHeap(this,(json *)local_578,(bool *)local_3b8,&this->scratch);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_578);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_578 + 8),(value_t)local_578[0]);
  c4::yml::Tree::~Tree(&local_130);
  if (local_4d8[0] != local_4c8) {
    operator_delete(local_4d8[0],local_4c8[0] + 1);
  }
  return (AST *)0x0;
}

Assistant:

const AST *builtinParseYaml(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "parseYaml", args, {Value::STRING});

        std::string value = encode_utf8(static_cast<HeapString *>(args[0].v.h)->value);

        ryml::Tree tree = treeFromString(value);

        json j;
        if (tree.is_stream(tree.root_id())) {
            // Split into individual yaml documents
            std::stringstream ss;
            ss << tree;
            std::vector<std::string> v = split(ss.str(), "---\n");

            // Convert yaml to json and push onto json array
            ryml::Tree doc;
            for (std::size_t i = 0; i < v.size(); ++i) {
                if (!v[i].empty()) {
                    doc = treeFromString(v[i]);
                    j.push_back(yamlTreeToJson(doc));
                }
            }
        } else {
            j = yamlTreeToJson(tree);
        }

        bool filled;

        otherJsonToHeap(j, filled, scratch);

        return nullptr;
    }